

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O3

void __thiscall
QOpenGLShaderProgram::setUniformValueArray
          (QOpenGLShaderProgram *this,int location,GLfloat *values,int count,int tupleSize)

{
  long lVar1;
  code *UNRECOVERED_JUMPTABLE;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (location != -1) {
    if (tupleSize - 1U < 4) {
      lVar1 = *(long *)&this->field_0x8;
      switch(tupleSize) {
      case 1:
        UNRECOVERED_JUMPTABLE = *(code **)(**(long **)(lVar1 + 0xd0) + 0x388);
        break;
      case 2:
        UNRECOVERED_JUMPTABLE = *(code **)(**(long **)(lVar1 + 0xd0) + 0x3a8);
        break;
      case 3:
        UNRECOVERED_JUMPTABLE = *(code **)(**(long **)(lVar1 + 0xd0) + 0x3c8);
        break;
      case 4:
        UNRECOVERED_JUMPTABLE = *(code **)(**(long **)(lVar1 + 0xd0) + 1000);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        (*UNRECOVERED_JUMPTABLE)(location,count);
        return;
      }
      goto LAB_0014f3b5;
    }
    local_28[0] = '\x02';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    local_10 = "default";
    QMessageLogger::warning
              (local_28,"QOpenGLShaderProgram::setUniformValue: size %d not supported",tupleSize);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0014f3b5:
  __stack_chk_fail();
}

Assistant:

void QOpenGLShaderProgram::setUniformValueArray(int location, const GLfloat *values, int count, int tupleSize)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    if (location != -1) {
        if (tupleSize == 1)
            d->glfuncs->glUniform1fv(location, count, values);
        else if (tupleSize == 2)
            d->glfuncs->glUniform2fv(location, count, values);
        else if (tupleSize == 3)
            d->glfuncs->glUniform3fv(location, count, values);
        else if (tupleSize == 4)
            d->glfuncs->glUniform4fv(location, count, values);
        else
            qWarning("QOpenGLShaderProgram::setUniformValue: size %d not supported", tupleSize);
    }
}